

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_com.c
# Opt level: O3

void hal_h265d_output_scalinglist_packet(void *hal,void *ptr,void *dxva)

{
  long lVar1;
  int iVar2;
  long lVar3;
  h265d_dxva2_picture_context_t *dxva_cxt;
  void *__s1;
  long lVar4;
  ulong uVar5;
  scalingList_t sl;
  scalingList_t local_63c;
  
  if ((*(byte *)((long)dxva + 0x18) & 1) == 0) {
    return;
  }
  __s1 = (void *)((long)dxva + 0x1a6c);
  iVar2 = bcmp(__s1,*(void **)((long)hal + 0x1a0),1000);
  if (iVar2 != 0) {
    uVar5 = 0;
    memset(&local_63c,0,0x60c);
    do {
      lVar4 = uVar5 * 0x40;
      lVar3 = 0;
      do {
        local_63c.sl[0][uVar5]
        [(ulong)hal_hevc_diag_scan4x4_x[lVar3] + (ulong)hal_hevc_diag_scan4x4_y[lVar3] * 4] =
             *(RK_U8 *)((long)__s1 + lVar3);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      lVar3 = 0;
      do {
        while( true ) {
          lVar1 = (ulong)hal_hevc_diag_scan8x8_x[lVar3] + (ulong)hal_hevc_diag_scan8x8_y[lVar3] * 8;
          local_63c.sl[1][uVar5][lVar1] = *(RK_U8 *)((long)dxva + lVar3 + lVar4 + 0x1acc);
          local_63c.sl[2][uVar5][lVar1] = *(RK_U8 *)((long)dxva + lVar3 + lVar4 + 0x1c4c);
          if (1 < uVar5) break;
          local_63c.sl[3][uVar5][lVar1] = *(RK_U8 *)((long)dxva + lVar3 + lVar4 + 0x1dcc);
          lVar3 = lVar3 + 1;
          if (lVar3 == 0x40) {
            local_63c.sl_dc[0][uVar5] = *(RK_U8 *)((long)dxva + 0x1e4c + uVar5);
            lVar4 = 0x606;
            lVar3 = (long)dxva + 0x1e52;
            goto LAB_001fadb8;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x40);
      lVar4 = 0x600;
      lVar3 = (long)dxva + 0x1e4c;
LAB_001fadb8:
      local_63c.sl[0][0][uVar5 + lVar4] = *(RK_U8 *)(lVar3 + uVar5);
      uVar5 = uVar5 + 1;
      __s1 = (void *)((long)__s1 + 0x10);
    } while (uVar5 != 6);
    hal_record_scaling_list(*(scalingFactor_t **)((long)hal + 0x198),&local_63c);
  }
  memcpy(ptr,*(void **)((long)hal + 0x198),0x550);
  return;
}

Assistant:

void hal_h265d_output_scalinglist_packet(void *hal, void *ptr, void *dxva)
{
    scalingList_t sl;
    RK_U32 i, j, pos;
    h265d_dxva2_picture_context_t *dxva_cxt = (h265d_dxva2_picture_context_t*)dxva;
    HalH265dCtx *reg_ctx = ( HalH265dCtx *)hal;
    if (!dxva_cxt->pp.scaling_list_enabled_flag) {
        return;
    }
    if (memcmp((void*)&dxva_cxt->qm, reg_ctx->scaling_qm, sizeof(DXVA_Qmatrix_HEVC))) {
        memset(&sl, 0, sizeof(scalingList_t));
        for (i = 0; i < 6; i++) {
            for (j = 0; j < 16; j++) {
                pos = 4 * hal_hevc_diag_scan4x4_y[j] + hal_hevc_diag_scan4x4_x[j];
                sl.sl[0][i][pos] = dxva_cxt->qm.ucScalingLists0[i][j];
            }

            for (j = 0; j < 64; j++) {
                pos = 8 * hal_hevc_diag_scan8x8_y[j] + hal_hevc_diag_scan8x8_x[j];
                sl.sl[1][i][pos] =  dxva_cxt->qm.ucScalingLists1[i][j];
                sl.sl[2][i][pos] =  dxva_cxt->qm.ucScalingLists2[i][j];

                if (i < 2)
                    sl.sl[3][i][pos] =  dxva_cxt->qm.ucScalingLists3[i][j];
            }

            sl.sl_dc[0][i] =  dxva_cxt->qm.ucScalingListDCCoefSizeID2[i];
            if (i < 2)
                sl.sl_dc[1][i] =  dxva_cxt->qm.ucScalingListDCCoefSizeID3[i];
        }
        hal_record_scaling_list((scalingFactor_t *)reg_ctx->scaling_rk, &sl);
    }
    memcpy(ptr, reg_ctx->scaling_rk, sizeof(scalingFactor_t));
}